

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O0

wchar_t ui_entry_renderer_lookup(char *name)

{
  int iVar1;
  wchar_t local_1c;
  wchar_t i;
  char *name_local;
  
  local_1c = L'\0';
  while( true ) {
    if (renderer_count <= local_1c) {
      return L'\0';
    }
    iVar1 = strcmp(name,renderers[local_1c].name);
    if (iVar1 == 0) break;
    local_1c = local_1c + L'\x01';
  }
  return local_1c + L'\x01';
}

Assistant:

int ui_entry_renderer_lookup(const char *name)
{
	int i = 0;

	while (i < renderer_count) {
		if (streq(name, renderers[i].name)) {
			return i + 1;
		}
		++i;
	}
	return 0;
}